

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauTools.cpp
# Opt level: O2

bool mau::SetCurrentThreadAffinity(uint processorIndex)

{
  int iVar1;
  pthread_t __th;
  cpu_set_t cpuset;
  
  cpuset.__bits[8] = 0;
  cpuset.__bits[9] = 0;
  cpuset.__bits[10] = 0;
  cpuset.__bits[0xb] = 0;
  cpuset.__bits[0xc] = 0;
  cpuset.__bits[0xd] = 0;
  cpuset.__bits[0xe] = 0;
  cpuset.__bits[0xf] = 0;
  cpuset.__bits[0] = 0;
  cpuset.__bits[1] = 0;
  cpuset.__bits[2] = 0;
  cpuset.__bits[3] = 0;
  cpuset.__bits[4] = 0;
  cpuset.__bits[5] = 0;
  cpuset.__bits[6] = 0;
  cpuset.__bits[7] = 0;
  if (processorIndex < 0x400) {
    cpuset.__bits[processorIndex >> 6] =
         cpuset.__bits[processorIndex >> 6] | 1L << ((ulong)processorIndex & 0x3f);
  }
  __th = pthread_self();
  iVar1 = pthread_setaffinity_np(__th,0x80,(cpu_set_t *)&cpuset);
  return iVar1 == 0;
}

Assistant:

bool SetCurrentThreadAffinity(unsigned processorIndex)
{
#ifdef _WIN32
    return 0 != ::SetThreadAffinityMask(
        ::GetCurrentThread(), (DWORD_PTR)1 << (processorIndex & 63));
#elif !defined(ANDROID)
    cpu_set_t cpuset;
    CPU_ZERO(&cpuset);
    CPU_SET(processorIndex, &cpuset);
    return 0 == pthread_setaffinity_np(pthread_self(),
        sizeof(cpu_set_t), &cpuset);
#else
    return true; // FIXME: Unused on Android anyway
#endif
}